

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall
cmComputeLinkInformation::CheckSharedLibNoSOName(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  undefined1 local_70 [8];
  string soname;
  undefined1 local_40 [8];
  string file;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  file.field_2._8_8_ = item;
  cmsys::SystemTools::GetFilenameName((string *)local_40,item);
  bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_70);
    bVar1 = cmSystemTools::GuessLibrarySOName((string *)file.field_2._8_8_,(string *)local_70);
    if (!bVar1) {
      AddSharedLibNoSOName(this,(string *)file.field_2._8_8_);
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_70);
    if (!bVar1) goto LAB_00852b8c;
  }
  this_local._7_1_ = 0;
LAB_00852b8c:
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeLinkInformation::CheckSharedLibNoSOName(std::string const& item)
{
  // This platform will use the path to a library as its soname if the
  // library is given via path and was not built with an soname.  If
  // this is a shared library that might be the case.
  std::string file = cmSystemTools::GetFilenameName(item);
  if (this->ExtractSharedLibraryName.find(file)) {
    // If we can guess the soname fairly reliably then assume the
    // library has one.  Otherwise assume the library has no builtin
    // soname.
    std::string soname;
    if (!cmSystemTools::GuessLibrarySOName(item, soname)) {
      this->AddSharedLibNoSOName(item);
      return true;
    }
  }
  return false;
}